

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# foreign_interface.c
# Opt level: O0

double get_double(char *identifer,int line,Environment *env)

{
  double dVar1;
  Object obj;
  Literal lit;
  int iVar2;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 auStack_60 [8];
  Object o;
  Environment *env_local;
  int line_local;
  char *identifer_local;
  
  o.field_1.routine.code.statements = (Statement *)env;
  env_get((Object *)auStack_60,identifer,line,env);
  if (auStack_60._0_4_ == OBJECT_LITERAL) {
    obj.field_1.instance = o.field_1.instance;
    obj.type = o.type;
    obj._4_4_ = o._4_4_;
    obj.field_1._8_8_ = o.field_1._8_8_;
    obj.field_1._16_8_ = o.field_1._16_8_;
    obj.field_1.routine.arguments = o.field_1.routine.arguments;
    obj.field_1._32_8_ = o.field_1._32_8_;
    obj.field_1.container.constructor.statements = o.field_1.container.constructor.statements;
    obj.field_1.routine.code.statements = (Statement *)in_stack_ffffffffffffff98;
    iVar2 = is_num(obj);
    if (iVar2 != 0) goto LAB_0010af84;
  }
  printf("\x1b[31m\n[Runtime Error] [Line:%d] Expected numeric value!\x1b[0m",(ulong)(uint)line);
  stop();
LAB_0010af84:
  lit.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)o.field_1.instance;
  lit.line = o.type;
  lit.type = o._4_4_;
  dVar1 = get_val(lit);
  return dVar1;
}

Assistant:

double get_double(char *identifer, int line, Environment *env){
    Object o = env_get(identifer, line, env);
    if(o.type != OBJECT_LITERAL || !is_num(o)){
        printf(runtime_error("Expected numeric value!"), line);
        stop();
    }
    return get_val(o.literal);
}